

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::emitStatement(PrintC *this,PcodeOp *inst)

{
  EmitXml *pEVar1;
  bool bVar2;
  uint uVar3;
  int4 id;
  PcodeOp *inst_local;
  PrintC *this_local;
  
  pEVar1 = (this->super_PrintLanguage).emit;
  uVar3 = (*pEVar1->_vptr_EmitXml[0xe])(pEVar1,inst);
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0xd])(this,inst);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0xf])(pEVar1,(ulong)uVar3);
  bVar2 = PrintLanguage::isSet(&this->super_PrintLanguage,0x200);
  if (!bVar2) {
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,";",8);
  }
  return;
}

Assistant:

void PrintC::emitStatement(const PcodeOp *inst)

{
  int4 id = emit->beginStatement(inst);
  emitExpression(inst);
  emit->endStatement(id);
  if (!isSet(comma_separate))
    emit->print(";");
}